

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface_p.h
# Opt level: O1

void QNetworkInterfacePrivate::calculateDnsEligibility
               (QNetworkAddressEntry *entry,bool isTemporary,bool isDeprecated)

{
  AddressClassification AVar1;
  undefined3 in_register_00000011;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  bool status;
  unique_ptr<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,isTemporary) == 0 &&
      CONCAT31(in_register_00000011,isDeprecated) == 0) {
    QNetworkAddressEntry::ip((QNetworkAddressEntry *)&local_28);
    AVar1 = QHostAddressPrivate::classify
                      ((QHostAddressPrivate *)
                       local_28._M_t.
                       super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
                       .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl);
    QHostAddress::~QHostAddress((QHostAddress *)&local_28);
    status = (AVar1 & ~LocalNetAddress) != LoopbackAddress;
  }
  else {
    status = false;
  }
  QNetworkAddressEntry::setDnsEligibility(entry,status);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void calculateDnsEligibility(QNetworkAddressEntry *entry, bool isTemporary,
                                        bool isDeprecated)
    {
        // this implements an algorithm that yields the same results as Windows
        // produces, for the same input (as far as I can test)
        if (isTemporary || isDeprecated) {
            entry->setDnsEligibility(QNetworkAddressEntry::DnsIneligible);
        } else {
            AddressClassification cl = QHostAddressPrivate::classify(entry->ip());
            if (cl == LoopbackAddress || cl == LinkLocalAddress)
                entry->setDnsEligibility(QNetworkAddressEntry::DnsIneligible);
            else
                entry->setDnsEligibility(QNetworkAddressEntry::DnsEligible);
        }
    }